

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

bool __thiscall features::Surf::descriptor_computation(Surf *this,Descriptor *descr,bool upright)

{
  Vector<float,_64> *__s;
  element_type *peVar1;
  int fs;
  long lVar2;
  int iVar3;
  int x;
  int iVar4;
  Vector<float,_64> *pVVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_88;
  float local_50;
  float local_4c;
  float dx;
  float dy;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  
  fs = (int)descr->scale;
  fVar7 = (float)(fs * 0xf + 1);
  if ((((fVar7 <= descr->x) && (fVar7 <= descr->y)) &&
      (peVar1 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      , descr->x + fVar7 < (float)(peVar1->super_TypedImageBase<long>).super_ImageBase.w)) &&
     (descr->y + fVar7 <= (float)(peVar1->super_TypedImageBase<long>).super_ImageBase.h)) {
    if (upright) {
      local_34 = 1.0;
      local_88 = 0.0;
    }
    else {
      local_88 = sinf(descr->orientation);
      local_34 = cosf(descr->orientation);
    }
    __s = &descr->data;
    memset(__s,0,0x100);
    local_38 = (float)fs;
    iVar3 = -10;
    pVVar5 = __s;
    do {
      dy = local_34 * ((float)iVar3 + 0.5);
      dx = ((float)iVar3 + 0.5) * -local_88;
      local_40 = iVar3 * iVar3;
      uVar6 = 0;
      iVar4 = -10;
      local_3c = iVar3;
      do {
        fVar7 = (local_34 * ((float)iVar4 + 0.5) + dx) * local_38 + descr->x;
        if (fVar7 <= 0.0) {
          fVar7 = ceilf(fVar7 + -0.5);
        }
        else {
          fVar7 = floorf(fVar7 + 0.5);
        }
        fVar8 = (((float)iVar4 + 0.5) * local_88 + dy) * local_38 + descr->y;
        if (fVar8 <= 0.0) {
          fVar8 = ceilf(fVar8 + -0.5);
        }
        else {
          fVar8 = floorf(fVar8 + 0.5);
        }
        filter_dx_dy(this,(int)fVar7,(int)fVar8,fs,&local_50,&local_4c);
        fVar8 = local_34 * local_50 + local_88 * local_4c;
        fVar9 = local_50 * -local_88 + local_4c * local_34;
        fVar7 = expf((float)(iVar4 * iVar4 + local_40) / -43.559998);
        pVVar5->v[0] = fVar7 * fVar8 + pVVar5->v[0];
        pVVar5->v[1] = fVar7 * fVar9 + pVVar5->v[1];
        pVVar5->v[2] = ABS(fVar8) * fVar7 + pVVar5->v[2];
        pVVar5->v[3] = ABS(fVar9) * fVar7 + pVVar5->v[3];
        pVVar5 = (Vector<float,_64> *)
                 (pVVar5->v + (ulong)((int)(uVar6 / 5) * -5 + -4 + iVar4 == -10) * 4);
        iVar4 = iVar4 + 1;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (iVar4 != 10);
      pVVar5 = (Vector<float,_64> *)
               (pVVar5->v +
               (ulong)(local_3c * -0x33333333 + 0xccccccceU < 0x33333333) * 0x10 + -0x10);
      iVar3 = local_3c + 1;
    } while (iVar3 != 10);
    fVar7 = 0.0;
    lVar2 = 0;
    do {
      fVar8 = *(float *)((long)__s->v + lVar2);
      fVar7 = fVar7 + fVar8 * fVar8;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x100);
    if (1e-08 < ABS(fVar7)) {
      if (fVar7 < 0.0) {
        fVar7 = sqrtf(fVar7);
      }
      else {
        fVar7 = SQRT(fVar7);
      }
      lVar2 = 0;
      do {
        *(float *)((long)__s->v + lVar2) = *(float *)((long)__s->v + lVar2) / fVar7;
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0x100);
      return true;
    }
  }
  return false;
}

Assistant:

bool
Surf::descriptor_computation (Descriptor* descr, bool upright)
{
    int const descr_scale = static_cast<int>(descr->scale);
    int const width = this->sat->width();
    int const height = this->sat->height();

    /*
     * Size of the descriptor is 20s (10s to each side). The Wavelet filter
     * have size 2s (1s to each side), plus one additional pixel for simpler
     * integral image lookup. Since the window can be rotated, 4s additional
     * pixel are needed.
     */
    float const spacing = static_cast<float>(15 * descr_scale + 1);
    if (descr->x < spacing || descr->y < spacing
        || descr->x + spacing >= width || descr->y + spacing > height)
        return false;

    float sin_ori = 0.0f, cos_ori = 1.0f;
    if (!upright)
    {
        sin_ori = std::sin(descr->orientation);
        cos_ori = std::cos(descr->orientation);
    }

    /* Interest point region has size 20 * scale. */
    descr->data.fill(0.0f);
    float* descr_iter = &descr->data[0];
    for (int y = -10; y < 10; ++y)
    {
        for (int x = -10; x < 10; ++x)
        {
            /* Rotate sample coordinate. */
            int rot_x = static_cast<int>(math::round(descr->x
                + (cos_ori * (x + 0.5f) - sin_ori * (y + 0.5f))
                * descr_scale));
            int rot_y = static_cast<int>(math::round(descr->y
                + (sin_ori * (x + 0.5f) + cos_ori * (y + 0.5f))
                * descr_scale));

            /* Obtain and rotate gradient. */
            float dx, dy;
            this->filter_dx_dy(rot_x, rot_y, descr_scale, &dx, &dy);
            float ori_dx = cos_ori * dx + sin_ori * dy;
            float ori_dy = -sin_ori * dx + cos_ori * dy;

            /* Keypoints are weighted with a Gaussian, sigma = 3.3*s. */
            float weight = std::exp(-static_cast<float>(x * x + y * y)
                / math::fastpow(2.0f * 3.3f, 2));
            *(descr_iter++) += weight * ori_dx;
            *(descr_iter++) += weight * ori_dy;
            *(descr_iter++) += weight * std::abs(ori_dx);
            *(descr_iter++) += weight * std::abs(ori_dy);

            if ((x + 10) % 5 != 4)
                descr_iter -= 4;
        }
        if ((y + 10) % 5 != 4)
            descr_iter -= 4 * 4;
    }

    /* Normalize descriptor, reject too small descriptors. */
    float norm = descr->data.square_norm();
    if (MATH_EPSILON_EQ(norm, 0.0f, 1e-8))  // TODO: Play with this.
        return false;
    descr->data /= std::sqrt(norm);

    return true;
}